

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::iterate(HEkkPrimal *this)

{
  bool bVar1;
  HighsDebugStatus HVar2;
  long *in_RDI;
  HEkkPrimal *unaff_retaddr;
  HEkkPrimal *in_stack_00000010;
  bool ok_rebuild_reason;
  HEkkPrimal *in_stack_00000040;
  HighsInt to_check_iter;
  HighsInt from_check_iter;
  HEkkPrimal *in_stack_00000068;
  HEkkPrimal *in_stack_00000088;
  HEkkPrimal *in_stack_000000a0;
  HEkkPrimal *in_stack_000002a0;
  HEkkPrimal *this_00;
  bool local_51;
  undefined1 local_31 [33];
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0xf;
  local_10 = 0x19;
  if ((*(byte *)(*in_RDI + 0x3870) & 1) != 0) {
    local_51 = false;
    if (0xe < *(int *)(*in_RDI + 0x36f8)) {
      local_51 = *(int *)(*in_RDI + 0x36f8) < 0x1a;
    }
    *(bool *)(*in_RDI + 0x3871) = local_51;
    if ((*(byte *)(*in_RDI + 0x3871) & 1) != 0) {
      printf("HEkkDual::iterate Debug iteration %d\n",(ulong)*(uint *)(*in_RDI + 0x36f8));
    }
  }
  this_00 = (HEkkPrimal *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Before iteration",(allocator *)this_00);
  HVar2 = debugPrimalSimplex(in_stack_00000068,(string *)this,from_check_iter._3_1_);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  if (HVar2 == kLogicalError) {
    *(undefined4 *)((long)in_RDI + 0x1c) = 0xfffffffd;
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x4c) = 0xfffffffe;
    chuzc(unaff_retaddr);
    if (*(int *)((long)in_RDI + 0x44) == -1) {
      *(undefined4 *)(in_RDI + 8) = 3;
    }
    else {
      bVar1 = useVariableIn(in_stack_00000088);
      if (bVar1) {
        if (*(int *)((long)in_RDI + 0x1c) == 1) {
          phase1ChooseRow(in_stack_000002a0);
          if (*(int *)((long)in_RDI + 0x4c) == -1) {
            highsLogDev((HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380),kError,
                        "Primal phase 1 choose row failed\n");
            *(undefined4 *)((long)in_RDI + 0x1c) = 0xfffffffd;
            return;
          }
        }
        else {
          chooseRow(in_stack_00000040);
        }
        considerBoundSwap(in_stack_00000010);
        if (((int)in_RDI[8] != 5) &&
           (((*(int *)((long)in_RDI + 0x4c) < 0 || (assessPivot(this_00), (int)in_RDI[8] == 0)) &&
            (bVar1 = isBadBasisChange((HEkkPrimal *)0x7a8809), !bVar1)))) {
          update(in_stack_000000a0);
          if ((*(int *)(*in_RDI + 0x28d8) == 0) && (*(int *)((long)in_RDI + 0x1c) == 1)) {
            *(undefined4 *)(in_RDI + 8) = 4;
          }
          bVar1 = true;
          if ((((int)in_RDI[8] != 0) && (bVar1 = true, (int)in_RDI[8] != 4)) &&
             ((bVar1 = true, (int)in_RDI[8] != 8 && (bVar1 = true, (int)in_RDI[8] != 2)))) {
            bVar1 = (int)in_RDI[8] == 1;
          }
          if (!bVar1) {
            printf("HEkkPrimal::rebuild Solve %d; Iter %d: rebuild_reason = %d\n",
                   (ulong)*(uint *)(*in_RDI + 0x3860),(ulong)*(uint *)(*in_RDI + 0x36f8),
                   (ulong)*(uint *)(in_RDI + 8));
            fflush(_stdout);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::iterate() {
  const HighsInt from_check_iter = 15;
  const HighsInt to_check_iter = from_check_iter + 10;
  if (ekk_instance_.debug_solve_report_) {
    ekk_instance_.debug_iteration_report_ =
        ekk_instance_.iteration_count_ >= from_check_iter &&
        ekk_instance_.iteration_count_ <= to_check_iter;
    if (ekk_instance_.debug_iteration_report_) {
      printf("HEkkDual::iterate Debug iteration %d\n",
             (int)ekk_instance_.iteration_count_);
    }
  }

  if (debugPrimalSimplex("Before iteration") ==
      HighsDebugStatus::kLogicalError) {
    solve_phase = kSolvePhaseError;
    return;
  }
  // Initialise row_out so that aborting iteration before CHUZR due to
  // numerical test of chosen reduced cost can be spotted - and
  // eliminates the unassigned read that can occur when the first
  // iteration is aborted in primal clean-up
  row_out = kNoRowSought;
  // Perform CHUZC
  //
  chuzc();
  if (variable_in == -1) {
    rebuild_reason = kRebuildReasonPossiblyOptimal;
    return;
  }

  // Perform FTRAN - and dual value cross-check to decide whether to use the
  // variable
  //
  // rebuild_reason = kRebuildReasonPossiblySingularBasis is set if
  // numerical trouble is detected
  if (!useVariableIn()) {
    if (rebuild_reason)
      assert(rebuild_reason == kRebuildReasonPossiblySingularBasis);
    return;
  }
  assert(!rebuild_reason);

  // Perform CHUZR
  if (solve_phase == kSolvePhase1) {
    phase1ChooseRow();
    assert(row_out != kNoRowSought);
    if (row_out == kNoRowChosen) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                  "Primal phase 1 choose row failed\n");
      solve_phase = kSolvePhaseError;
      return;
    }
  } else {
    chooseRow();
  }
  assert(!rebuild_reason);

  // Consider whether to perform a bound swap - either because it's
  // shorter than the pivoting step or, in the case of Phase 1,
  // because it's cheaper than pivoting - which may be questionable
  //
  // rebuild_reason = kRebuildReasonPossiblyPrimalUnbounded is set
  // in phase 2 if there's no pivot or bound swap. In phase 1 there is
  // always a pivot at this stage since row_out < 0 is trapped (above)
  // as an error.
  assert(solve_phase == kSolvePhase2 || row_out >= 0);
  considerBoundSwap();
  if (rebuild_reason == kRebuildReasonPossiblyPrimalUnbounded) return;
  assert(!rebuild_reason);

  if (row_out >= 0) {
    //
    // Perform unit BTRAN and PRICE to get pivotal row - and do a
    // numerical check.
    //
    // rebuild_reason = kRebuildReasonPossiblySingularBasis is set
    // if numerical trouble is detected
    assessPivot();
    if (rebuild_reason) {
      assert(rebuild_reason == kRebuildReasonPossiblySingularBasis);
      return;
    }
  }

  if (isBadBasisChange()) return;

  // Any pivoting is numerically acceptable, so perform update.
  //
  // rebuild_reason =
  // kRebuildReasonPrimalInfeasibleInPrimalSimplex is set if a
  // primal infeasibility is found in phase 2
  //
  // rebuild_reason = kRebuildReasonPossiblyPhase1Feasible is set in
  // phase 1 if the number of primal infeasibilities is reduced to
  // zero
  //
  // rebuild_reason = kRebuildReasonUpdateLimitReached is set in
  // either phase if the update count reaches the limit!
  //
  // rebuild_reason = kRebuildReasonSyntheticClockSaysInvert is
  // set in updateFactor() if it is considered to be more efficient to
  // reinvert.
  update();
  // Force rebuild if there are no infeasibilities in phase 1
  if (!ekk_instance_.info_.num_primal_infeasibilities &&
      solve_phase == kSolvePhase1)
    rebuild_reason = kRebuildReasonPossiblyPhase1Feasible;

  const bool ok_rebuild_reason =
      rebuild_reason == kRebuildReasonNo ||
      rebuild_reason == kRebuildReasonPossiblyPhase1Feasible ||
      rebuild_reason == kRebuildReasonPrimalInfeasibleInPrimalSimplex ||
      rebuild_reason == kRebuildReasonSyntheticClockSaysInvert ||
      rebuild_reason == kRebuildReasonUpdateLimitReached;
  if (!ok_rebuild_reason) {
    printf("HEkkPrimal::rebuild Solve %d; Iter %d: rebuild_reason = %d\n",
           (int)ekk_instance_.debug_solve_call_num_,
           (int)ekk_instance_.iteration_count_, (int)rebuild_reason);
    fflush(stdout);
  }
  assert(ok_rebuild_reason);
  assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2);
}